

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceBaseTest::initTest(TessellationShaderInvarianceBaseTest *this)

{
  glGetUniformLocationFunc p_Var1;
  TessellationShaderInvarianceBaseTest *pTVar2;
  GLuint GVar3;
  int iVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  GLuint shader_id;
  uint local_b8;
  GLenum local_b4;
  TessellationShaderInvarianceBaseTest *local_b0;
  _test_program program;
  GLint link_status;
  GLuint local_90;
  GLuint local_8c;
  uint local_88;
  GLenum local_84;
  char **xfb_names;
  undefined8 local_78;
  undefined1 local_70 [16];
  ulong local_60;
  _programs *local_58;
  uint n_xfb_names;
  Functions *gl;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x12d);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x130);
  (*gl->genQueries)(1,&this->m_qo_tfpw_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glGenQueries() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x134);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils_ptr = this_00;
  (*gl->genBuffers)(1,&this->m_bo_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x13e);
  (*gl->bindBuffer)(0x8c8e,this->m_bo_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x141);
  local_60 = 0;
  (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x145);
  local_88 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  local_58 = &this->m_programs;
  std::
  vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
  ::reserve(local_58,(ulong)local_88);
  local_b4 = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
  GVar5 = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
  local_b8 = 0;
  local_90 = 0;
  local_8c = 0;
  local_b0 = this;
  local_84 = GVar5;
  do {
    if (local_b8 == local_88) {
      return;
    }
    program.po_id = (*gl->createProgram)();
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x157);
    if ((initTest()::shader_types == '\0') &&
       (iVar4 = __cxa_guard_acquire(&initTest()::shader_types), iVar4 != 0)) {
      initTest::shader_types[0] = 0x8b30;
      initTest::shader_types[1] = local_b4;
      initTest::shader_types[3] = 0x8b31;
      initTest::shader_types[2] = GVar5;
      __cxa_guard_release(&initTest()::shader_types);
    }
    for (lVar9 = 0; pTVar2 = local_b0, lVar9 != 0x10; lVar9 = lVar9 + 4) {
      xfb_names = (char **)local_70;
      local_78 = 0;
      _link_status = (char **)0x0;
      shader_id = 0;
      local_70[0] = 0;
      GVar6 = *(GLenum *)((long)initTest::shader_types + lVar9);
      if ((GVar6 != 0x8b30 && GVar6 != GVar5) && (GVar6 != 0x8b31 && GVar6 != local_b4)) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Unrecognized shader type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                   ,0x170);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      bVar10 = GVar6 == GVar5;
      bVar11 = local_b8 == 0;
      if (bVar11 || bVar10) {
        shader_id = (*gl->createShader)(GVar6);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glCreateShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x17f);
        if (GVar6 == 0x8b30) {
          (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])
                    (&n_xfb_names,local_b0,(ulong)local_b8);
        }
        else if (GVar6 == local_b4) {
          (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                    (&n_xfb_names,local_b0,(ulong)local_b8);
        }
        else if (GVar6 == GVar5) {
          (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                    (&n_xfb_names,local_b0,(ulong)local_b8);
        }
        else {
          if (GVar6 != 0x8b31) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Unrecognized shader type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                       ,0x194);
            goto LAB_00d06e0e;
          }
          (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                    (&n_xfb_names,local_b0,(ulong)local_b8);
        }
        std::__cxx11::string::operator=((string *)&xfb_names,(string *)&n_xfb_names);
        std::__cxx11::string::~string((string *)&n_xfb_names);
        _link_status = xfb_names;
        TestCaseBase::shaderSourceSpecialized
                  (&local_b0->super_TestCaseBase,shader_id,1,(GLchar **)&link_status);
        GVar5 = local_84;
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glShaderSource() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x19a);
        TessellationShaderUtils::compileShaders(local_b0->m_utils_ptr,1,&shader_id,true);
        if (GVar6 != GVar5) {
          if (GVar6 == 0x8b30) {
            local_8c = shader_id;
          }
          else if (GVar6 == local_b4) {
            local_90 = shader_id;
          }
          else {
            if (GVar6 != 0x8b31) {
              pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar8,"Unrecognized shader type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                         ,0x1b6);
LAB_00d06e0e:
              __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            local_60 = (ulong)shader_id;
          }
        }
      }
      else {
        shader_id = (GLuint)local_60;
        if (GVar6 == local_b4) {
          shader_id = local_90;
        }
        if (GVar6 == 0x8b30) {
          shader_id = local_8c;
        }
      }
      (*gl->attachShader)(program.po_id,shader_id);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                      ,0x1c6);
      if (bVar11 || bVar10) {
        (*gl->deleteShader)(shader_id);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glDeleteShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                        ,0x1cc);
      }
      std::__cxx11::string::~string((string *)&xfb_names);
    }
    n_xfb_names = 0;
    xfb_names = (char **)0x0;
    (*(local_b0->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
              (local_b0,(ulong)local_b8,&n_xfb_names,&xfb_names);
    (*gl->transformFeedbackVaryings)(program.po_id,n_xfb_names,xfb_names,0x8c8c);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glTransformFeedbackVaryings() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1d7);
    _link_status = (char **)((ulong)_link_status & 0xffffffff00000000);
    (*gl->linkProgram)(program.po_id);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glLinkProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1dd);
    (*gl->getProgramiv)(program.po_id,0x8b82,&link_status);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1e0);
    GVar3 = program.po_id;
    if (link_status != 1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                 ,0x1e4);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    p_Var1 = gl->getUniformLocation;
    iVar4 = (*(pTVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(pTVar2);
    program.inner_tess_level_uniform_location =
         (*p_Var1)(GVar3,(GLchar *)CONCAT44(extraout_var_00,iVar4));
    GVar3 = program.po_id;
    p_Var1 = gl->getUniformLocation;
    iVar4 = (*(pTVar2->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(pTVar2)
    ;
    program.outer_tess_level_uniform_location =
         (*p_Var1)(GVar3,(GLchar *)CONCAT44(extraout_var_01,iVar4));
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGetUniformLocation() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                    ,0x1ed);
    std::
    vector<glcts::TessellationShaderInvarianceBaseTest::_test_program,_std::allocator<glcts::TessellationShaderInvarianceBaseTest::_test_program>_>
    ::push_back(local_58,&program);
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

void TessellationShaderInvarianceBaseTest::initTest()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  shared_fs_id = 0;
	glw::GLuint			  shared_tc_id = 0;
	glw::GLuint			  shared_te_id = 0;
	glw::GLuint			  shared_vs_id = 0;

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Initialize GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object */
	gl.genQueries(1, &m_qo_tfpw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries() call failed");

	/* Initialize tessellation shader utils */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize a buffer object we will use to store XFB data.
	 * Note: we intentionally skip a glBufferData() call here,
	 *       the actual buffer storage size is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* Iterate through all iterations */
	const unsigned int n_iterations = getAmountOfIterations();
	m_programs.reserve(n_iterations);

	const glw::GLenum SHADER_TYPE_FRAGMENT				  = GL_FRAGMENT_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_CONTROL	= m_glExtTokens.TESS_CONTROL_SHADER;
	const glw::GLenum SHADER_TYPE_TESSELLATION_EVALUATION = m_glExtTokens.TESS_EVALUATION_SHADER;
	const glw::GLenum SHADER_TYPE_VERTEX				  = GL_VERTEX_SHADER;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_test_program program;

		/* Create an iteration-specific program object */
		program.po_id = gl.createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		/* Query the implementation on which shader types should be compiled on
		 * a per-iteration basis, and which can be initialized only once */
		static const glw::GLenum shader_types[] = { SHADER_TYPE_FRAGMENT, SHADER_TYPE_TESSELLATION_CONTROL,
													SHADER_TYPE_TESSELLATION_EVALUATION, SHADER_TYPE_VERTEX };
		static const unsigned int n_shader_types = sizeof(shader_types) / sizeof(shader_types[0]);

		for (unsigned int n_shader_type = 0; n_shader_type < n_shader_types; ++n_shader_type)
		{
			std::string shader_body;
			const char* shader_body_ptr = DE_NULL;
			glw::GLuint shader_id		= 0;
			glw::GLenum shader_type		= shader_types[n_shader_type];
			glw::GLenum shader_type_es  = (glw::GLenum)shader_type;

			// Check whether the test should use a separate program objects for each iteration.
			bool is_shader_iteration_specific = false;
			if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
			{
				is_shader_iteration_specific = true;
			}
			else if ((shader_type != SHADER_TYPE_FRAGMENT) && (shader_type != SHADER_TYPE_TESSELLATION_CONTROL) &&
					 (shader_type != SHADER_TYPE_VERTEX))
			{
				TCU_FAIL("Unrecognized shader type");
			}

			/* We need to initialize the shader object if:
			 *
			 * - its body differs between iterations;
			 * - its body is shared by all iterations AND this is the first iteration
			 */
			bool has_shader_been_generated = false;

			if ((!is_shader_iteration_specific && n_iteration == 0) || is_shader_iteration_specific)
			{
				/* Create the shader object */
				has_shader_been_generated = true;
				shader_id				  = gl.createShader(shader_type_es);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				/* Assign shader body to the object */
				if (shader_type == SHADER_TYPE_FRAGMENT)
				{
					shader_body = getFSCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
				{
					shader_body = getTCCode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
				{
					shader_body = getTECode(n_iteration);
				}
				else if (shader_type == SHADER_TYPE_VERTEX)
				{
					shader_body = getVSCode(n_iteration);
				}
				else
				{
					TCU_FAIL("Unrecognized shader type");
				}

				shader_body_ptr = shader_body.c_str();

				shaderSourceSpecialized(shader_id, 1, &shader_body_ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				/* Compile the shader object */
				m_utils_ptr->compileShaders(1,				   /* n_shaders */
											&shader_id, true); /* should_succeed */

				/* If this is a shader object that will be shared by all iterations, cache it
				 * in a dedicated variable */
				if (!is_shader_iteration_specific)
				{
					if (shader_type == SHADER_TYPE_FRAGMENT)
					{
						shared_fs_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_CONTROL)
					{
						shared_tc_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_TESSELLATION_EVALUATION)
					{
						shared_te_id = shader_id;
					}
					else if (shader_type == SHADER_TYPE_VERTEX)
					{
						shared_vs_id = shader_id;
					}
					else
					{
						TCU_FAIL("Unrecognized shader type");
					}
				} /* if (!is_shader_iteration_specific) */
			}	 /* if (shader object needs to be initialized) */
			else
			{
				shader_id = (shader_type == SHADER_TYPE_FRAGMENT) ?
								shared_fs_id :
								(shader_type == SHADER_TYPE_TESSELLATION_CONTROL) ?
								shared_tc_id :
								(shader_type == SHADER_TYPE_TESSELLATION_EVALUATION) ? shared_te_id : shared_vs_id;
			}

			/* Attach the shader object to iteration-specific program object */
			gl.attachShader(program.po_id, shader_id);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

			/* Now that the object has been attached, we can flag it for deletion */
			if (has_shader_been_generated)
			{
				gl.deleteShader(shader_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed");
			}
		} /* for (all shader types) */

		/* Set up transform feed-back */
		unsigned int n_xfb_names = 0;
		const char** xfb_names   = NULL;

		getXFBProperties(n_iteration, &n_xfb_names, &xfb_names);

		gl.transformFeedbackVaryings(program.po_id, n_xfb_names, xfb_names, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(program.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

		gl.getProgramiv(program.po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Retrieve inner/outer tess level uniform locations */
		program.inner_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getInnerTessLevelUniformName());
		program.outer_tess_level_uniform_location =
			gl.getUniformLocation(program.po_id, getOuterTessLevelUniformName());

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

		/* Store the program object */
		m_programs.push_back(program);
	} /* for (all iterations) */
}